

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_module *psVar1;
  sqlite3_vtab_cursor pStmt_00;
  int iVar2;
  char *pcVar3;
  Mem *pMem;
  i64 iVar4;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var5;
  sqlite3_vtab_cursor *psVar6;
  Fts5Table *pTab;
  int rc;
  sqlite3_stmt *pStmt;
  int local_2c;
  sqlite3_vtab_cursor local_28;
  
  local_2c = 0;
  local_28.pVtab = (sqlite3_vtab *)0x0;
  psVar1 = pVTab[1].pModule;
  pTab = (Fts5Table *)0x0;
  pcVar3 = sqlite3Fts5Mprintf(&local_2c,"SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH \'*id\'",
                              psVar1,*(undefined8 *)&pVTab[1].nRef,psVar1,psVar1);
  if (pcVar3 != (char *)0x0) {
    local_2c = sqlite3LockAndPrepare
                         ((sqlite3 *)pVTab[1].zErrMsg,pcVar3,-1,0x80,(Vdbe *)0x0,
                          (sqlite3_stmt **)&local_28,(char **)0x0);
  }
  sqlite3_free(pcVar3);
  pStmt_00.pVtab = local_28.pVtab;
  if (local_2c == 1) {
    local_2c = 0;
  }
  if (local_28.pVtab != (sqlite3_vtab *)0x0) {
    iVar2 = sqlite3_step((sqlite3_stmt *)local_28.pVtab);
    if (iVar2 == 100) {
      pMem = columnMem((sqlite3_stmt *)pStmt_00.pVtab,0);
      iVar4 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure((sqlite3_stmt *)pStmt_00.pVtab);
      for (p_Var5 = (pVTab[2].pModule)->xNext;
          (p_Var5 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0 && (*(long *)(p_Var5 + 0x18) != iVar4)
          ); p_Var5 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var5 + 8)) {
      }
      if (p_Var5 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0) {
        pTab = *(Fts5Table **)p_Var5;
        goto LAB_001b261a;
      }
    }
    pTab = (Fts5Table *)0x0;
  }
LAB_001b261a:
  if (local_2c == 0) {
    if (pTab == (Fts5Table *)0x0) {
      local_2c = sqlite3_finalize((sqlite3_stmt *)pStmt_00.pVtab);
      local_28.pVtab = (sqlite3_vtab *)0x0;
      if (local_2c == 0) {
        pcVar3 = sqlite3_mprintf("no such fts5 table: %s.%s",*(undefined8 *)&pVTab[1].nRef,
                                 pVTab[1].pModule);
        pVTab->zErrMsg = pcVar3;
        local_2c = 1;
      }
    }
    else {
      local_2c = sqlite3Fts5FlushToDisk(pTab);
    }
  }
  if (local_2c == 0) {
    psVar6 = (sqlite3_vtab_cursor *)
             sqlite3Fts5MallocZero(&local_2c,(long)(pTab->pConfig->nCol * 0x10 + 0x78));
  }
  else {
    psVar6 = (sqlite3_vtab_cursor *)0x0;
  }
  if (psVar6 == (sqlite3_vtab_cursor *)0x0) {
    sqlite3_finalize((sqlite3_stmt *)local_28.pVtab);
  }
  else {
    psVar6[2].pVtab = &pTab->base;
    psVar6[1].pVtab = local_28.pVtab;
    psVar6[8].pVtab = (sqlite3_vtab *)(psVar6 + 0xf);
    psVar6[9].pVtab = (sqlite3_vtab *)(psVar6 + (long)pTab->pConfig->nCol + 0xf);
  }
  *ppCsr = psVar6;
  return local_2c;
}

Assistant:

static int fts5VocabOpenMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_vtab_cursor **ppCsr
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pVTab;
  Fts5Table *pFts5 = 0;
  Fts5VocabCursor *pCsr = 0;
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  char *zSql = 0;

  zSql = sqlite3Fts5Mprintf(&rc,
      "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH '*id'",
      pTab->zFts5Tbl, pTab->zFts5Db, pTab->zFts5Tbl, pTab->zFts5Tbl
  );
  if( zSql ){
    rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pStmt, 0);
  }
  sqlite3_free(zSql);
  assert( rc==SQLITE_OK || pStmt==0 );
  if( rc==SQLITE_ERROR ) rc = SQLITE_OK;

  if( pStmt && sqlite3_step(pStmt)==SQLITE_ROW ){
    i64 iId = sqlite3_column_int64(pStmt, 0);
    pFts5 = sqlite3Fts5TableFromCsrid(pTab->pGlobal, iId);
  }

  if( rc==SQLITE_OK ){
    if( pFts5==0 ){
      rc = sqlite3_finalize(pStmt);
      pStmt = 0;
      if( rc==SQLITE_OK ){
        pVTab->zErrMsg = sqlite3_mprintf(
            "no such fts5 table: %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
            );
        rc = SQLITE_ERROR;
      }
    }else{
      rc = sqlite3Fts5FlushToDisk(pFts5);
    }
  }

  if( rc==SQLITE_OK ){
    int nByte = pFts5->pConfig->nCol * sizeof(i64)*2 + sizeof(Fts5VocabCursor);
    pCsr = (Fts5VocabCursor*)sqlite3Fts5MallocZero(&rc, nByte);
  }

  if( pCsr ){
    pCsr->pFts5 = pFts5;
    pCsr->pStmt = pStmt;
    pCsr->aCnt = (i64*)&pCsr[1];
    pCsr->aDoc = &pCsr->aCnt[pFts5->pConfig->nCol];
  }else{
    sqlite3_finalize(pStmt);
  }

  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}